

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclablePromiseObjectWalker::Get
          (RecyclablePromiseObjectWalker *this,int i,ResolvedObject *pResolvedObject)

{
  Var aValue;
  code *pcVar1;
  PromiseStatus PVar2;
  bool bVar3;
  BOOL BVar4;
  JavascriptPromise *this_00;
  undefined4 *puVar5;
  JavascriptLibrary *pJVar6;
  JavascriptString *pJVar7;
  RecyclableObject *this_01;
  IDiagObjectModelDisplay *pIVar8;
  JavascriptString *local_68;
  Var result;
  JavascriptPromise *promise;
  ResolvedObject *pResolvedObject_local;
  int i_local;
  RecyclablePromiseObjectWalker *this_local;
  TypeId local_18;
  TypeId typeId;
  
  this_00 = VarTo<Js::JavascriptPromise>((this->super_RecyclableObjectWalker).instance);
  if (i == 0) {
    pResolvedObject->name = L"[status]";
    PVar2 = JavascriptPromise::GetStatus(this_00);
    switch(PVar2) {
    case PromiseStatusCode_Undefined:
      pJVar6 = ScriptContext::GetLibrary((this->super_RecyclableObjectWalker).scriptContext);
      pJVar7 = JavascriptLibrary::GetUndefinedDisplayString(pJVar6);
      pResolvedObject->obj = pJVar7;
      break;
    case PromiseStatusCode_Unresolved:
      pJVar6 = ScriptContext::GetLibrary((this->super_RecyclableObjectWalker).scriptContext);
      pJVar7 = JavascriptLibrary::CreateStringFromCppLiteral<8ul>(pJVar6,(char16 (*) [8])0x17f0946);
      pResolvedObject->obj = pJVar7;
      break;
    case PromiseStatusCode_HasResolution:
      pJVar6 = ScriptContext::GetLibrary((this->super_RecyclableObjectWalker).scriptContext);
      pJVar7 = JavascriptLibrary::CreateStringFromCppLiteral<9ul>(pJVar6,(char16 (*) [9])0x1994c8a);
      pResolvedObject->obj = pJVar7;
      break;
    case PromiseStatusCode_HasRejection:
      pJVar6 = ScriptContext::GetLibrary((this->super_RecyclableObjectWalker).scriptContext);
      pJVar7 = JavascriptLibrary::CreateStringFromCppLiteral<9ul>
                         (pJVar6,(char16 (*) [9])L"rejected");
      pResolvedObject->obj = pJVar7;
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xf0f,"(false)","New PromiseStatusCode not handled in debugger");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
      pJVar6 = ScriptContext::GetLibrary((this->super_RecyclableObjectWalker).scriptContext);
      pJVar7 = JavascriptLibrary::GetUndefinedDisplayString(pJVar6);
      pResolvedObject->obj = pJVar7;
    }
  }
  else {
    if (i != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xf1c,"(false)","false");
      if (bVar3) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
        return 0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pResolvedObject->name = L"[value]";
    local_68 = (JavascriptString *)JavascriptPromise::GetResult(this_00);
    if (local_68 == (JavascriptString *)0x0) {
      pJVar6 = ScriptContext::GetLibrary((this->super_RecyclableObjectWalker).scriptContext);
      local_68 = JavascriptLibrary::GetUndefinedDisplayString(pJVar6);
    }
    pResolvedObject->obj = local_68;
  }
  pResolvedObject->propId = -1;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  aValue = pResolvedObject->obj;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = TaggedInt::Is(aValue);
  if (bVar3) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
    if (bVar3) {
      local_18 = TypeIds_Number;
    }
    else {
      this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this_01 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this_01);
      if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(this_01), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  pResolvedObject->typeId = local_18;
  pIVar8 = ResolvedObject::CreateDisplay(pResolvedObject);
  pResolvedObject->objectDisplay = pIVar8;
  (*pResolvedObject->objectDisplay->_vptr_IDiagObjectModelDisplay[6])
            (pResolvedObject->objectDisplay,0x820);
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  return 1;
}

Assistant:

BOOL RecyclablePromiseObjectWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        JavascriptPromise* promise = VarTo<JavascriptPromise>(instance);

        if (i == 0)
        {
            pResolvedObject->name = _u("[status]");

            switch (promise->GetStatus())
            {
            case JavascriptPromise::PromiseStatusCode_Undefined:
                pResolvedObject->obj = scriptContext->GetLibrary()->GetUndefinedDisplayString();
                break;
            case JavascriptPromise::PromiseStatusCode_Unresolved:
                pResolvedObject->obj = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("pending"));
                break;
            case JavascriptPromise::PromiseStatusCode_HasResolution:
                pResolvedObject->obj = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("resolved"));
                break;
            case JavascriptPromise::PromiseStatusCode_HasRejection:
                pResolvedObject->obj = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("rejected"));
                break;
            default:
                AssertMsg(false, "New PromiseStatusCode not handled in debugger");
                pResolvedObject->obj = scriptContext->GetLibrary()->GetUndefinedDisplayString();
                break;
            }
        }
        else if (i == 1)
        {
            pResolvedObject->name = _u("[value]");
            Var result = promise->GetResult();
            pResolvedObject->obj = result != nullptr ? result : scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }
        else
        {
            Assert(false);
            return FALSE;
        }

        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->objectDisplay = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY | DBGPROP_ATTRIB_VALUE_IS_FAKE);
        pResolvedObject->address = nullptr;

        return TRUE;
    }